

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::SwapElements
          (RepeatedField<absl::lts_20250127::Cord> *this,int index1,int index2)

{
  bool is_soo;
  Cord *pCVar1;
  Cord *elem;
  int index2_local;
  int index1_local;
  RepeatedField<absl::lts_20250127::Cord> *this_local;
  
  is_soo = RepeatedField<absl::lts_20250127::Cord>::is_soo(this);
  pCVar1 = elements(this,is_soo);
  absl::lts_20250127::swap(pCVar1 + index1,pCVar1 + index2);
  return;
}

Assistant:

void RepeatedField<Element>::SwapElements(int index1, int index2) {
  Element* elem = elements(is_soo());
  using std::swap;  // enable ADL with fallback
  swap(elem[index1], elem[index2]);
}